

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall
cfdcapi_key_CombinePubkeysTest1_Test::TestBody(cfdcapi_key_CombinePubkeysTest1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *combine_handle;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffcf8;
  AssertionResult *in_stack_fffffffffffffd00;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  char *in_stack_fffffffffffffd10;
  AssertionResult *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  char *in_stack_fffffffffffffd70;
  AssertionResult *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  void **in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  AssertHelper local_208;
  Message local_200;
  undefined4 local_1f4;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  char *local_198;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  char **in_stack_fffffffffffffe88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  AssertHelper in_stack_fffffffffffffe98;
  Message local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  undefined8 local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffd18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36843a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x36849d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3684f2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(type *)0x368526);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x368622);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36869d);
  local_a0 = (char *)0x0;
  local_a8 = 0;
  local_14 = CfdInitializeCombinePubkey
                       ((void *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                        in_stack_fffffffffffffdc0);
  local_bc = 0;
  pAVar3 = &local_b8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36877e);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x172,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x3687e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x368839);
  if (local_14 == 0) {
    local_14 = CfdAddCombinePubkey(in_stack_fffffffffffffe98.data_,in_stack_fffffffffffffe90.ptr_,
                                   (char *)in_stack_fffffffffffffe88);
    local_e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (int *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x368917);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x176,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x36897a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3689d2);
    local_14 = CfdAddCombinePubkey(in_stack_fffffffffffffe98.data_,in_stack_fffffffffffffe90.ptr_,
                                   (char *)in_stack_fffffffffffffe88);
    local_10c = 0;
    in_stack_fffffffffffffd90 = &local_108;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (int *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd9f =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd90);
    if (!(bool)in_stack_fffffffffffffd9f) {
      testing::Message::Message(&local_118);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x368aa2);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x17a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x368b05);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368b5d);
    local_14 = CfdFinalizeCombinePubkey
                         (in_stack_fffffffffffffe98.data_,in_stack_fffffffffffffe90.ptr_,
                          in_stack_fffffffffffffe88);
    local_134 = 0;
    pAVar3 = &local_130;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (int *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      in_stack_fffffffffffffd70 =
           testing::AssertionResult::failure_message((AssertionResult *)0x368c2e);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x17d,in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x368c8b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368ce0);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_158,
                 "\"022a66efd1ea9b1ad3acfcc62a5ce8c756fa6fc3917fce3d4952a8701244ed1049\"","output",
                 "022a66efd1ea9b1ad3acfcc62a5ce8c756fa6fc3917fce3d4952a8701244ed1049",local_a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x368d83);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x17f,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe98,&local_160);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe98);
        testing::Message::~Message((Message *)0x368de0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x368e35);
      CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
    }
    local_14 = CfdFreeCombinePubkeyHandle(pAVar3,in_stack_fffffffffffffd70);
    local_17c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (int *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe88);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x368f01);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x184,pcVar2);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::Message::~Message((Message *)0x368f5e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368fb3);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffd3f,
                                                  in_stack_fffffffffffffd38));
  if (local_14 != 0) {
    local_198 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                          (char **)in_stack_fffffffffffffd90);
    local_1ac = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (int *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3690a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x18b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x3690fd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x369152);
    in_stack_fffffffffffffd18 = &local_1d0;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffd18,"\"\"","str_buffer","",local_198);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd18);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      in_stack_fffffffffffffd10 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3691e7);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x18c,in_stack_fffffffffffffd10);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      testing::Message::~Message((Message *)0x369244);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x369299);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
    local_198 = (char *)0x0;
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
  local_1f4 = 0;
  pAVar3 = &local_1f0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffd18->success_,in_stack_fffffffffffffd10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (int *)pAVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x369369);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x192,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message((Message *)0x3693c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x369419);
  return;
}

Assistant:

TEST(cfdcapi_key, CombinePubkeysTest1) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  void* combine_handle = nullptr;
  ret = CfdInitializeCombinePubkey(handle, &combine_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdAddCombinePubkey(handle, combine_handle,
        "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddCombinePubkey(handle, combine_handle,
        "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdFinalizeCombinePubkey(handle, combine_handle, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("022a66efd1ea9b1ad3acfcc62a5ce8c756fa6fc3917fce3d4952a8701244ed1049", output);
      CfdFreeStringBuffer(output);
    }

    ret = CfdFreeCombinePubkeyHandle(handle, combine_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}